

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O1

bool __thiscall spv::Builder::isGlobalVariable(Builder *this,Id resultId)

{
  Instruction *pIVar1;
  StorageClass SVar2;
  Id typeId;
  
  pIVar1 = (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
           super__Vector_impl_data._M_start[resultId];
  typeId = 0;
  if (pIVar1->opCode == OpVariable) {
    if (pIVar1 != (Instruction *)0x0) {
      typeId = pIVar1->typeId;
    }
    SVar2 = Module::getStorageClass(&this->module,typeId);
    typeId = (Id)(SVar2 != Function);
  }
  return SUB41(typeId,0);
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }